

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O1

RC __thiscall
QL_Manager::JoinRelationWithQO
          (QL_Manager *this,QL_Node **topNode,QO_Rel *qorels,QL_Node *currNode,int qoIdx)

{
  char **ppcVar1;
  int relIndex;
  int iVar2;
  uint subNodeAttr;
  uint indexNumber;
  RelCatEntry *pRVar3;
  Condition *pCVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Condition condition;
  bool bVar7;
  Condition *pCVar8;
  QL_Node **ppQVar9;
  RC RVar10;
  QL_NodeRel *this_00;
  int *attrs;
  mapped_type *pmVar11;
  QL_NodeJoin *this_01;
  long lVar12;
  int iVar13;
  uint indexAttr;
  RelAttr attr;
  int index1;
  int index2;
  int numConds;
  string relString;
  uint local_7c;
  uint local_78;
  int local_74;
  QL_Node **local_70;
  long local_68;
  QO_Rel *local_60;
  QL_Node *local_58;
  key_type local_50;
  
  local_68 = (long)qoIdx * 3;
  relIndex = qorels[qoIdx].relIdx;
  local_70 = topNode;
  local_60 = qorels;
  local_58 = currNode;
  this_00 = (QL_NodeRel *)operator_new(0x120);
  QL_NodeRel::QL_NodeRel(this_00,this,this->relEntries + relIndex);
  pRVar3 = this->relEntries;
  attrs = (int *)malloc((long)pRVar3[relIndex].attrCount << 2);
  attrs[0] = 0;
  attrs[1] = 0;
  if (0 < pRVar3[relIndex].attrCount) {
    lVar12 = 0;
    do {
      attrs[lVar12] = 0;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pRVar3[relIndex].attrCount);
  }
  std::__cxx11::string::string((string *)&local_50,pRVar3[relIndex].relName,(allocator *)&local_74);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::operator[](&this->relToAttrIndex,&local_50);
  pRVar3 = this->relEntries;
  iVar13 = pRVar3[relIndex].attrCount;
  if (0 < iVar13) {
    iVar2 = *pmVar11;
    lVar12 = 0;
    do {
      attrs[lVar12] = iVar2 + (int)lVar12;
      lVar12 = lVar12 + 1;
      iVar13 = pRVar3[relIndex].attrCount;
    } while (lVar12 < iVar13);
  }
  QL_NodeRel::SetUpNode(this_00,attrs,iVar13);
  free(attrs);
  CountNumConditions(this,relIndex,&local_74);
  this_01 = (QL_NodeJoin *)operator_new(0x70);
  QL_NodeJoin::QL_NodeJoin(this_01,this,local_58,(QL_Node *)this_00);
  RVar10 = QL_NodeJoin::SetUpNode(this_01,local_74);
  if (RVar10 != 0) goto LAB_00110209;
  *local_70 = (QL_Node *)this_01;
  subNodeAttr = (&local_60->indexAttr)[local_68];
  if ((long)(int)subNodeAttr != -1) {
    iVar13 = (&local_60->indexCond)[local_68];
    local_7c = 0;
    local_78 = 0;
    RVar10 = iVar13 * 0x38;
    attr.attrName = this->condptr[iVar13].lhsAttr.attrName;
    attr.relName = this->condptr[iVar13].lhsAttr.relName;
    GetAttrCatEntryPos(this,attr,(int *)&local_7c);
    if (this->condptr[iVar13].bRhsIsAttr != 0) {
      GetAttrCatEntryPos(this,this->condptr[iVar13].rhsAttr,(int *)&local_78);
    }
    indexAttr = local_7c;
    if (local_7c == subNodeAttr) {
      indexAttr = local_78;
    }
    indexNumber = this->attrEntries[(int)subNodeAttr].indexNo;
    if (indexNumber == 0xffffffff) {
LAB_00110319:
      bVar7 = true;
    }
    else {
      if (this->condptr[iVar13].bRhsIsAttr == 0) {
        RVar10 = (*(this_00->super_QL_Node)._vptr_QL_Node[8])
                           (this_00,(ulong)subNodeAttr,(ulong)indexNumber,
                            this->condptr[iVar13].rhsValue.data);
      }
      else {
        if ((indexNumber == 0xffffffff) || (this->condptr[iVar13].bRhsIsAttr == 0))
        goto LAB_00110319;
        RVar10 = QL_NodeJoin::UseIndexJoin(this_01,indexAttr,subNodeAttr,indexNumber);
      }
      if (RVar10 == 0) goto LAB_00110319;
      bVar7 = false;
    }
    if (!bVar7) goto LAB_00110209;
  }
  ppQVar9 = local_70;
  local_7c = 0;
  RVar10 = 0;
  if (0 < this->nConds) {
    do {
      pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&this->conditionToRel,(key_type *)&local_7c);
      if (*pmVar11 == relIndex) {
        pCVar4 = this->condptr;
        lVar12 = (long)(int)local_7c;
        pCVar8 = pCVar4 + lVar12;
        uVar5 = pCVar8->op;
        uVar6 = pCVar8->bRhsIsAttr;
        condition.bRhsIsAttr = uVar6;
        condition.op = uVar5;
        ppcVar1 = &pCVar4[lVar12].rhsAttr.attrName;
        condition.lhsAttr = pCVar4[lVar12].lhsAttr;
        condition.rhsAttr.relName = ((RelAttr *)(&pCVar8->op + 2))->relName;
        condition.rhsAttr.attrName = *ppcVar1;
        condition.rhsValue._0_8_ = ppcVar1[1];
        condition.rhsValue.data = pCVar4[lVar12].rhsValue.data;
        RVar10 = QL_Node::AddCondition(*ppQVar9,condition,local_7c);
        if (RVar10 != 0) break;
      }
      local_7c = local_7c + 1;
      RVar10 = 0;
    } while ((int)local_7c < this->nConds);
  }
LAB_00110209:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return RVar10;
}

Assistant:

RC QL_Manager::JoinRelationWithQO(QL_Node *&topNode, QO_Rel* qorels, QL_Node *currNode, int qoIdx){
  RC rc = 0;
  int relIndex = qorels[qoIdx].relIdx;
  // create new relation node, providing the relation entry
  QL_NodeRel *relNode = new QL_NodeRel(*this, relEntries + relIndex);

  // Set up the list of indices corresponding to attributes in the relation
  int *attrList = (int *)malloc(relEntries[relIndex].attrCount * sizeof(int));
  memset((void *)attrList, 0, sizeof(attrList));
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = 0;
  }
  string relString(relEntries[relIndex].relName);
  int start = relToAttrIndex[relString]; // get the offset of the first attr in this relation
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = start + i;
  }
  // Set up the relation node by providing the attribute list and # of attributes
  relNode->SetUpNode(attrList, relEntries[relIndex].attrCount);
  free(attrList);

  // Count the # of conditions associated with this attribute
  int numConds;
  CountNumConditions(relIndex, numConds);

  // create new join node:
  QL_NodeJoin *joinNode = new QL_NodeJoin(*this, *currNode, *relNode);
  if((rc = joinNode->SetUpNode(numConds))) // provide a max count on # of conditions
    return (rc);                           // to add to this join
  topNode = joinNode;

  if(qorels[qoIdx].indexAttr != -1){
    int condIdx = qorels[qoIdx].indexCond;
    int index = qorels[qoIdx].indexAttr;
    int index1 = 0;
    int index2 = 0;
    GetAttrCatEntryPos(condptr[condIdx].lhsAttr, index1);
    if(condptr[condIdx].bRhsIsAttr)
      GetAttrCatEntryPos(condptr[condIdx].rhsAttr, index2);
    int otherAttr;
    if(index1 == index)
      otherAttr = index2;
    else
      otherAttr = index1;
    if((attrEntries[index].indexNo != -1) && !condptr[condIdx].bRhsIsAttr){ // add only if there is an index on this attribute
      //cout << "adding index join on attr " << index; 
      if((rc = relNode->UseIndex(index, attrEntries[index].indexNo, condptr[condIdx].rhsValue.data) ))
        return (rc);
    }
    else if((attrEntries[index].indexNo != -1) && condptr[condIdx].bRhsIsAttr){
      //cout << "adding, lhs attr: " << otherAttr << ", rhsATtr: " << index << endl;
      if((rc = joinNode->UseIndexJoin(otherAttr, index, attrEntries[index].indexNo)))
        return (rc);
    }
  }
  for(int i = 0 ; i < nConds; i++){
    if(conditionToRel[i] == relIndex){
      if((rc = topNode->AddCondition(condptr[i], i) ))
        return (rc);
    }
  }
  return (0);
}